

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O2

json_t * parse_value(lex_t *lex,size_t flags,json_error_t *error)

{
  size_t __n;
  size_t __n_00;
  json_error_code jVar1;
  int iVar2;
  ulong uVar3;
  json_t *json;
  void *pvVar4;
  json_t *pjVar5;
  char *pcVar6;
  
  uVar3 = lex->depth + 1;
  lex->depth = uVar3;
  if (0x800 < uVar3) {
    pcVar6 = "maximum parsing depth reached";
    jVar1 = json_error_stack_overflow;
    goto LAB_0011866f;
  }
  iVar2 = lex->token;
  switch(iVar2) {
  case 0x100:
    pcVar6 = (lex->value).string.val;
    __n = (lex->value).string.len;
    if (((flags & 0x10) == 0) && (pvVar4 = memchr(pcVar6,0,__n), pvVar4 != (void *)0x0)) {
      pcVar6 = "\\u0000 is not allowed without JSON_ALLOW_NUL";
      jVar1 = json_error_null_character;
      goto LAB_0011866f;
    }
    json = jsonp_stringn_nocheck_own(pcVar6,__n);
    (lex->value).string.val = (char *)0x0;
    (lex->value).string.len = 0;
    break;
  case 0x101:
    json = json_integer((lex->value).integer);
    break;
  case 0x102:
    json = json_real((lex->value).real);
    break;
  case 0x103:
    json = json_true();
    break;
  case 0x104:
    json = json_false();
    break;
  case 0x105:
    json = json_null();
    break;
  default:
    if (iVar2 == -1) {
      pcVar6 = "invalid token";
LAB_001188db:
      jVar1 = json_error_invalid_syntax;
LAB_0011866f:
      error_set(error,lex,jVar1,pcVar6);
      return (json_t *)0x0;
    }
    if (iVar2 == 0x5b) {
      json = json_array();
      if (json != (json_t *)0x0) {
        lex_scan(lex,error);
        iVar2 = lex->token;
        if (iVar2 == 0x5d) goto LAB_001188cb;
        while (iVar2 != 0) {
          pjVar5 = parse_value(lex,flags,error);
          if ((pjVar5 == (json_t *)0x0) || (iVar2 = json_array_append_new(json,pjVar5), iVar2 != 0))
          goto LAB_00118956;
          lex_scan(lex,error);
          if (lex->token != 0x2c) {
            if (lex->token == 0x5d) goto LAB_001188c2;
            break;
          }
          lex_scan(lex,error);
          iVar2 = lex->token;
        }
        pcVar6 = "\']\' expected";
LAB_00118946:
        jVar1 = json_error_invalid_syntax;
LAB_00118948:
        error_set(error,lex,jVar1,pcVar6);
LAB_00118956:
        json_delete(json);
      }
      goto LAB_0011895e;
    }
    if (iVar2 != 0x7b) {
      pcVar6 = "unexpected token";
      goto LAB_001188db;
    }
    json = json_object();
    if (json == (json_t *)0x0) goto LAB_0011895e;
    lex_scan(lex,error);
    iVar2 = lex->token;
    if (iVar2 != 0x7d) {
      while (iVar2 == 0x100) {
        pcVar6 = (lex->value).string.val;
        __n_00 = (lex->value).string.len;
        (lex->value).string.val = (char *)0x0;
        (lex->value).string.len = 0;
        if (pcVar6 == (char *)0x0) goto LAB_0011895e;
        pvVar4 = memchr(pcVar6,0,__n_00);
        if (pvVar4 != (void *)0x0) {
          jsonp_free(pcVar6);
          pcVar6 = "NUL byte in object key not supported";
          jVar1 = json_error_null_byte_in_key;
          goto LAB_00118948;
        }
        if (((flags & 1) != 0) &&
           (pjVar5 = json_object_getn(json,pcVar6,__n_00), pjVar5 != (json_t *)0x0)) {
          jsonp_free(pcVar6);
          pcVar6 = "duplicate object key";
          jVar1 = json_error_duplicate_key;
          goto LAB_00118948;
        }
        lex_scan(lex,error);
        if (lex->token != 0x3a) {
          jsonp_free(pcVar6);
          pcVar6 = "\':\' expected";
          goto LAB_00118946;
        }
        lex_scan(lex,error);
        pjVar5 = parse_value(lex,flags,error);
        if (pjVar5 == (json_t *)0x0) {
          jsonp_free(pcVar6);
          goto LAB_00118956;
        }
        iVar2 = json_object_setn_new_nocheck(json,pcVar6,__n_00,pjVar5);
        jsonp_free(pcVar6);
        if (iVar2 != 0) goto LAB_00118956;
        lex_scan(lex,error);
        if (lex->token != 0x2c) {
          if (lex->token == 0x7d) goto LAB_001188c2;
          pcVar6 = "\'}\' expected";
          goto LAB_00118946;
        }
        lex_scan(lex,error);
        iVar2 = lex->token;
      }
      pcVar6 = "string or \'}\' expected";
      goto LAB_00118946;
    }
    goto LAB_001188cb;
  }
LAB_001188c2:
  if (json == (json_t *)0x0) {
LAB_0011895e:
    json = (json_t *)0x0;
  }
  else {
LAB_001188cb:
    lex->depth = lex->depth - 1;
  }
  return json;
}

Assistant:

static json_t *parse_value(lex_t *lex, size_t flags, json_error_t *error) {
    json_t *json;

    lex->depth++;
    if (lex->depth > JSON_PARSER_MAX_DEPTH) {
        error_set(error, lex, json_error_stack_overflow, "maximum parsing depth reached");
        return NULL;
    }

    switch (lex->token) {
        case TOKEN_STRING: {
            const char *value = lex->value.string.val;
            size_t len = lex->value.string.len;

            if (!(flags & JSON_ALLOW_NUL)) {
                if (memchr(value, '\0', len)) {
                    error_set(error, lex, json_error_null_character,
                              "\\u0000 is not allowed without JSON_ALLOW_NUL");
                    return NULL;
                }
            }

            json = jsonp_stringn_nocheck_own(value, len);
            lex->value.string.val = NULL;
            lex->value.string.len = 0;
            break;
        }

        case TOKEN_INTEGER: {
            json = json_integer(lex->value.integer);
            break;
        }

        case TOKEN_REAL: {
            json = json_real(lex->value.real);
            break;
        }

        case TOKEN_TRUE:
            json = json_true();
            break;

        case TOKEN_FALSE:
            json = json_false();
            break;

        case TOKEN_NULL:
            json = json_null();
            break;

        case '{':
            json = parse_object(lex, flags, error);
            break;

        case '[':
            json = parse_array(lex, flags, error);
            break;

        case TOKEN_INVALID:
            error_set(error, lex, json_error_invalid_syntax, "invalid token");
            return NULL;

        default:
            error_set(error, lex, json_error_invalid_syntax, "unexpected token");
            return NULL;
    }

    if (!json)
        return NULL;

    lex->depth--;
    return json;
}